

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall google::protobuf::FieldDescriptorProto::SharedDtor(FieldDescriptorProto *this)

{
  ulong uVar1;
  FieldOptions *this_00;
  undefined8 *puVar2;
  LogMessage *other;
  LogFinisher local_49;
  LogMessage local_48;
  
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if (puVar2 != (undefined8 *)0x0) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0xdf4);
    other = internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    internal::LogFinisher::operator=(&local_49,other);
    internal::LogMessage::~LogMessage(&local_48);
  }
  if ((undefined8 *)(this->name_).tagged_ptr_.ptr_ !=
      &internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::DestroyNoArenaSlowPath(&this->name_);
  }
  if ((undefined8 *)(this->extendee_).tagged_ptr_.ptr_ !=
      &internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::DestroyNoArenaSlowPath(&this->extendee_);
  }
  if ((undefined8 *)(this->type_name_).tagged_ptr_.ptr_ !=
      &internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::DestroyNoArenaSlowPath(&this->type_name_);
  }
  if ((undefined8 *)(this->default_value_).tagged_ptr_.ptr_ !=
      &internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::DestroyNoArenaSlowPath(&this->default_value_);
  }
  if ((undefined8 *)(this->json_name_).tagged_ptr_.ptr_ !=
      &internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::DestroyNoArenaSlowPath(&this->json_name_);
  }
  if (this != (FieldDescriptorProto *)_FieldDescriptorProto_default_instance_) {
    this_00 = this->options_;
    if (this_00 != (FieldOptions *)0x0) {
      FieldOptions::~FieldOptions(this_00);
    }
    operator_delete(this_00);
  }
  return;
}

Assistant:

inline void FieldDescriptorProto::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  name_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  extendee_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  type_name_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  default_value_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  json_name_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (this != internal_default_instance()) delete options_;
}